

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void getPLU(double *A,int M,int N,int *ipiv,double *P,double *L,double *U)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  double *pdVar8;
  int iVar9;
  double *pdVar10;
  ulong uVar11;
  
  lVar1 = (long)M;
  if (P != (double *)0x0) {
    for (uVar4 = 0; (uint)(M * M) != uVar4; uVar4 = uVar4 + 1) {
      P[uVar4] = 0.0;
    }
    uVar4 = 0;
    uVar5 = 0;
    if (0 < M) {
      uVar5 = (ulong)(uint)M;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      P[ipiv[uVar4] * lVar1 + uVar4] = 1.0;
    }
  }
  iVar2 = M - N;
  if (iVar2 == 0) {
    if (L != (double *)0x0) {
      uVar4 = 0;
      uVar5 = 0;
      if (0 < M) {
        uVar5 = (ulong)(uint)M;
      }
      iVar2 = 1;
      pdVar8 = L;
      pdVar10 = A;
      for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
        lVar6 = (long)iVar2;
        for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
          pdVar8[uVar11] = pdVar10[uVar11];
        }
        L[uVar4 * lVar1 + uVar4] = 1.0;
        for (; lVar6 < lVar1; lVar6 = lVar6 + 1) {
          pdVar8[lVar6] = 0.0;
        }
        iVar2 = iVar2 + 1;
        pdVar10 = pdVar10 + lVar1;
        pdVar8 = pdVar8 + lVar1;
      }
    }
    if (U != (double *)0x0) {
      uVar4 = 0;
      uVar5 = 0;
      if (0 < M) {
        uVar5 = (ulong)(uint)M;
      }
      uVar11 = (ulong)(uint)M;
      pdVar8 = U;
      for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
        for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
          U[uVar7] = 0.0;
        }
        for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
          pdVar8[uVar7] = A[uVar7];
        }
        U = U + lVar1;
        uVar11 = uVar11 - 1;
        A = A + lVar1 + 1;
        pdVar8 = pdVar8 + lVar1 + 1;
      }
    }
  }
  else if (iVar2 == 0 || M < N) {
    if (M < N) {
      if (L != (double *)0x0) {
        uVar4 = 0;
        uVar5 = 0;
        if (0 < M) {
          uVar5 = (ulong)(uint)M;
        }
        iVar2 = 1;
        pdVar8 = L;
        pdVar10 = A;
        for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
          lVar6 = (long)iVar2;
          for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
            pdVar8[uVar11] = pdVar10[uVar11];
          }
          L[uVar4 * lVar1 + uVar4] = 1.0;
          for (; lVar6 < lVar1; lVar6 = lVar6 + 1) {
            pdVar8[lVar6] = 0.0;
          }
          iVar2 = iVar2 + 1;
          pdVar8 = pdVar8 + lVar1;
          pdVar10 = pdVar10 + N;
        }
      }
      if (U != (double *)0x0) {
        uVar5 = 0;
        uVar4 = (ulong)(uint)M;
        if (M < 1) {
          uVar4 = uVar5;
        }
        uVar11 = 0;
        pdVar8 = U;
        while( true ) {
          uVar7 = uVar11 & 0xffffffff;
          if ((int)uVar11 < N) {
            uVar7 = (ulong)(uint)N;
          }
          if (uVar11 == uVar4) break;
          for (uVar3 = 0; uVar11 != uVar3; uVar3 = uVar3 + 1) {
            U[uVar3] = 0.0;
          }
          for (lVar1 = 0; uVar7 + uVar5 != lVar1; lVar1 = lVar1 + 1) {
            pdVar8[lVar1] = A[lVar1];
          }
          uVar11 = uVar11 + 1;
          U = U + N;
          uVar5 = uVar5 - 1;
          A = A + (long)N + 1;
          pdVar8 = pdVar8 + (long)N + 1;
        }
      }
    }
  }
  else {
    if (L != (double *)0x0) {
      lVar1 = (long)N;
      uVar4 = 0;
      uVar5 = 0;
      if (0 < N) {
        uVar5 = (ulong)(uint)N;
      }
      iVar9 = 1;
      pdVar8 = L;
      pdVar10 = A;
      for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
        lVar6 = (long)iVar9;
        for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
          pdVar8[uVar11] = pdVar10[uVar11];
        }
        L[uVar4 * lVar1 + uVar4] = 1.0;
        for (; lVar6 < lVar1; lVar6 = lVar6 + 1) {
          pdVar8[lVar6] = 0.0;
        }
        iVar9 = iVar9 + 1;
        pdVar10 = pdVar10 + lVar1;
        pdVar8 = pdVar8 + lVar1;
      }
      memcpy(L + (uint)(N * N),A + (uint)(N * N),lVar1 * iVar2 * 8);
    }
    if (U != (double *)0x0) {
      uVar4 = 0;
      uVar5 = 0;
      if (0 < N) {
        uVar5 = (ulong)(uint)N;
      }
      uVar11 = (ulong)(uint)N;
      pdVar8 = U;
      for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
        for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
          U[uVar7] = 0.0;
        }
        for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
          pdVar8[uVar7] = A[uVar7];
        }
        U = U + N;
        uVar11 = uVar11 - 1;
        A = A + (long)N + 1;
        pdVar8 = pdVar8 + (long)N + 1;
      }
    }
  }
  return;
}

Assistant:

void getPLU(double *A, int M , int N, int *ipiv,double *P, double *L, double *U) {
	int i, j,k;
	// Initialize all the arrays
	// P - M*M 
	// M > N
	// L - M*N , U - N*N
	// M = N
	// L - M*M , U M*M
	// M < N
	// L - M*M, U - M*N

	if (P) {
		for (i = 0; i < M*M; ++i) {
			P[i] = 0.0;
		}
		for (j = 0; j < M; ++j) {
			P[ipiv[j]*M + j] = 1.0;
		}
	}

	if (M == N) {
		if (L) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*M + j] = A[i*M + j];
				}
				L[i*M + i] = 1.0;
				for (j = i + 1; j < M; ++j) {
					L[i*M + j] = 0.0;
				}
			}
		}
		if (U) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*M + j] = 0.0;
				}
				for (j = i; j < M; ++j) {
					U[i*M + j] = A[i*M + j];
				}
			}
		}
	}
	else if (M > N) {
		if (L) {
			for (i = 0; i < N; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*N + j] = A[i*N + j];
				}
				L[i*N + i] = 1.0;
				for (j = i + 1; j < N; ++j) {
					L[i*N + j] = 0.0;
				}
			}
			memcpy(L + N*N, A + N*N, sizeof(double)*(M - N)*N);
		}
		if (U) {
			for (i = 0; i < N; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*N + j] = 0.0;
				}
				for (j = i; j < N; ++j) {
					U[i*N + j] = A[i*N + j];
				}
			}
		}
	}
	else if (M < N) {
		if (L) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					L[i*M + j] = A[i*N + j];
				}
				L[i*M + i] = 1.0;
				for (j = i + 1; j < M; ++j) {
					L[i*M + j] = 0.0;
				}
			}
		}

		if (U) {
			for (i = 0; i < M; ++i) {
				for (j = 0; j < i; ++j) {
					U[i*N + j] = 0.0;
				}
				for (j = i; j < N; ++j) {
					U[i*N + j] = A[i*N + j];
				}
			}
		}
	}
}